

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
gvr::(anonymous_namespace)::PLYProperty::toString_abi_cxx11_(PLYProperty *this)

{
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_140 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  string local_120 [32];
  string local_100 [12];
  ply_type in_stack_ffffffffffffff0c;
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [32];
  string local_50 [32];
  string local_30 [48];
  
  if (*(int *)(in_RSI + 0x28) == 0) {
    pbVar1 = local_70;
    __lhs = in_RDI;
    type2Name_abi_cxx11_(in_stack_ffffffffffffff0c);
    std::operator+((char *)__lhs,pbVar1);
    std::operator+(__lhs,(char *)pbVar1);
    std::operator+(__lhs,pbVar1);
    std::__cxx11::string::~string(local_30);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string((string *)local_70);
  }
  else {
    pbVar1 = in_RDI;
    type2Name_abi_cxx11_(in_stack_ffffffffffffff0c);
    std::operator+((char *)pbVar1,in_stack_fffffffffffffea0);
    std::operator+(pbVar1,(char *)in_stack_fffffffffffffea0);
    type2Name_abi_cxx11_(in_stack_ffffffffffffff0c);
    std::operator+(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    std::operator+(pbVar1,(char *)in_stack_fffffffffffffea0);
    std::operator+(pbVar1,in_stack_fffffffffffffea0);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string(local_c0);
    std::__cxx11::string::~string(local_140);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string(local_120);
  }
  return in_RDI;
}

Assistant:

std::string PLYProperty::toString() const
{
  if (tsize == ply_none)
  {
    return "property "+type2Name(tvalue)+" "+name;
  }
  else
  {
    return "property list "+type2Name(tsize)+" "+type2Name(tvalue)+" "+name;
  }
}